

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferBindingValidator::validateSingleBlock
          (BufferBindingValidator *this,InterfaceBlock *block,
          vector<int,_std::allocator<int>_> *instanceIndex,string *resource,GLint propValue,
          string *implementationName)

{
  ostringstream *poVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  TestContext *pTVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  undefined1 local_1a8 [16];
  TestLog local_198 [13];
  ios_base local_130 [264];
  
  iVar2 = (block->layout).binding;
  if (iVar2 == -1) {
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying buffer binding, expecting a valid binding",0x33);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    if (-1 < propValue) {
      return;
    }
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tError, invalid buffer binding, got ",0x24);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"buffer binding invalid","")
    ;
    pTVar5 = (this->super_SingleBlockValidator).super_PropValidator.m_testCtx;
    if (pTVar5->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_FAIL,(char *)local_1a8._0_8_);
    }
  }
  else {
    piVar3 = (block->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (block->dimensions).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    uVar6 = (int)((ulong)((long)piVar4 - (long)piVar3) >> 2) - 1;
    iVar9 = 0;
    if (-1 < (int)uVar6) {
      uVar7 = (ulong)uVar6;
      iVar9 = 0;
      iVar8 = 1;
      do {
        iVar9 = iVar9 + (instanceIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar7] * iVar8;
        iVar8 = iVar8 * piVar3[uVar7];
        bVar10 = uVar7 != 0;
        uVar7 = uVar7 - 1;
      } while (bVar10);
    }
    if (piVar3 == piVar4) {
      iVar9 = 0;
    }
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Verifying block binding, expecting ",0x23);
    iVar9 = iVar9 + iVar2;
    std::ostream::operator<<(poVar1,iVar9);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    if (iVar9 == propValue) {
      return;
    }
    local_1a8._0_8_ = ((this->super_SingleBlockValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\tError, invalid buffer binding, got ",0x24);
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    local_1a8._0_8_ = local_198;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"buffer binding invalid","")
    ;
    pTVar5 = (this->super_SingleBlockValidator).super_PropValidator.m_testCtx;
    if (pTVar5->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_FAIL,(char *)local_1a8._0_8_);
    }
  }
  if ((TestLog *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,(ulong)((long)&(local_198[0].m_log)->flags + 1));
  }
  return;
}

Assistant:

void BufferBindingValidator::validateSingleBlock (const glu::InterfaceBlock& block, const std::vector<int>& instanceIndex, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	DE_UNREF(resource);
	DE_UNREF(implementationName);

	if (block.layout.binding != -1)
	{
		int flatIndex		= 0;
		int dimensionSize	= 1;

		for (int dimensionNdx = (int)(block.dimensions.size()) - 1; dimensionNdx >= 0; --dimensionNdx)
		{
			flatIndex += dimensionSize * instanceIndex[dimensionNdx];
			dimensionSize *= block.dimensions[dimensionNdx];
		}

		const int expected = (block.dimensions.empty()) ? (block.layout.binding) : (block.layout.binding + flatIndex);
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying block binding, expecting " << expected << tcu::TestLog::EndMessage;

		if (propValue != expected)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid buffer binding, got " << propValue << tcu::TestLog::EndMessage;
			setError("buffer binding invalid");
		}
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying buffer binding, expecting a valid binding" << tcu::TestLog::EndMessage;

		if (propValue < 0)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, invalid buffer binding, got " << propValue << tcu::TestLog::EndMessage;
			setError("buffer binding invalid");
		}
	}
}